

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_exceptions.cpp
# Opt level: O2

void joined_subflow_2(uint W)

{
  char *pcVar1;
  code *pcVar2;
  double dVar3;
  char extraout_AL;
  Executor *this;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  atomic<bool> post_join;
  bool local_2c9;
  shared_ptr<tf::WorkerInterface> local_2c8;
  Result local_2b8;
  ResultBuilder DOCTEST_RB;
  atomic<bool> *local_220;
  Enum local_218;
  Taskflow taskflow;
  Executor executor;
  
  local_2c8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_2c8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_2c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2c8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tf::Taskflow::Taskflow(&taskflow);
  post_join._M_base._M_i = (__atomic_base<bool>)false;
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
  *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
       &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
  *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) = 0;
  *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
  pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
  (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
  *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
  *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
  *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
       &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
  *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
  *(atomic<bool> **)&DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = &post_join;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
       (char *)std::
               _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:337:20)>
               ::_M_invoke;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
       (double)std::
               _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:337:20)>
               ::_M_manager;
  *(undefined8 *)((long)&DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0 + 8) = 0;
  *(undefined8 *)((long)&DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0 + 0x10) = 0;
  *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_line = 0;
  *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 3;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)taskflow.super_FlowBuilder._graph,
             (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
  this = &executor;
  tf::Executor::run((Future<void> *)&DOCTEST_RB,this,&taskflow);
  std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB,this);
  tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB);
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData._71_2_ = 0x17;
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
  DOCTEST_RB.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp"
  ;
  DOCTEST_RB.super_AssertData.m_line = 0x15f;
  DOCTEST_RB.super_AssertData.m_expr = "post_join == false";
  DOCTEST_RB.super_AssertData.m_failed = true;
  DOCTEST_RB.super_AssertData.m_threw = false;
  DOCTEST_RB.super_AssertData.m_threw_as = false;
  DOCTEST_RB.super_AssertData.m_exception_type = "";
  DOCTEST_RB.super_AssertData.m_exception_string = "";
  local_2c9 = false;
  local_220 = &post_join;
  local_218 = DOCTEST_RB.super_AssertData.m_at;
  doctest::detail::Expression_lhs<std::atomic<bool>const&>::operator==
            (&local_2b8,(Expression_lhs<std::atomic<bool>const&> *)&local_220,&local_2c9);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_2b8);
  doctest::String::~String(&local_2b8.m_decomp);
  dVar3 = doctest::detail::ResultBuilder::log
                    (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if (extraout_AL != '\0') {
    pcVar2 = (code *)swi(3);
    (*pcVar2)(SUB84(dVar3,0));
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  tf::Taskflow::~Taskflow(&taskflow);
  tf::Executor::~Executor(&executor);
  return;
}

Assistant:

void joined_subflow_2(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::atomic<bool> post_join {false};

  taskflow.emplace([&](tf::Subflow& sf0){
    for (int j = 0; j < 16; ++j) {
      sf0.emplace([] () {
        throw std::runtime_error("x");
      });
    }
    try {
      sf0.join();
      post_join = true;
    } catch(const std::runtime_error& re) {
      REQUIRE(std::strcmp(re.what(), "x") == 0);
    }
  });
  executor.run(taskflow).wait();
  REQUIRE(post_join == false);
}